

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-prepared.c
# Opt level: O2

char * borg_must_return_to_town(void)

{
  int iVar1;
  uint range;
  int *piVar2;
  _Bool _Var3;
  char *pcVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  
  range = borg.trait[0x69];
  if (range == 0) {
    return (char *)0x0;
  }
  if ((range != 100) && (borg_t - borg_began < 100)) {
    return (char *)0x0;
  }
  if (borg.ready_morgoth == L'\xffffffff') {
    borg.ready_morgoth = L'\0';
  }
  if (borg_cfg[0xd] != 0) {
    lVar7 = 0;
    while( true ) {
      if (borg_formulas.restock.count <= lVar7) {
        return (char *)0x0;
      }
      piVar2 = (int *)borg_formulas.restock.items[lVar7];
      if ((int)range < *piVar2) break;
      _Var3 = check_condition(*(math_section **)(piVar2 + 4),range);
      lVar7 = lVar7 + 1;
      if (_Var3) {
        return *(char **)(piVar2 + 2);
      }
    }
    return (char *)0x0;
  }
  if (borg.trait[0x1a] < 1) {
    return "restock light radius < 1";
  }
  if (1 < (int)range) {
    if (borg.trait[0x27] < 3) {
      return "restock food < 3";
    }
    if (5 < range) {
      if (borg.trait[0xd2] < 1) {
        return "restock phase door";
      }
      iVar1 = borg.trait[0x24];
      if ((iVar1 < 0x1e) &&
         (iVar5 = borg.trait[0xe8] + borg.trait[0xe9] + borg.trait[0xe7],
         iVar5 == 0 || SCARRY4(borg.trait[0xe8] + borg.trait[0xe9],borg.trait[0xe7]) != iVar5 < 0))
      {
        return "restock clw+csw+ccw";
      }
      if (9 < range) {
        if ((borg.trait[0x1a] == 1) && (borg.trait[0x19] != 4)) {
          return "2 light radius";
        }
        if ((iVar1 < 0x1e) && (borg.trait[0xe8] + borg.trait[0xe9] + borg.trait[0xe7] < 2)) {
          return "restock clw + csw + ccw ";
        }
        uVar6 = borg.trait[0xd4] + borg.trait[0xd3];
        if ((int)uVar6 < 2) {
          return "restock tele + tele staff < 2";
        }
        if (0x13 < range) {
          if ((iVar1 < 0x1e) && (borg.trait[0xe7] + borg.trait[0xe8] < 4)) {
            return "restock csw + ccw < 4";
          }
          if (uVar6 < 4) {
            return "restock 4 > teleport + teleport staff ";
          }
          if (0x23 < range) {
            if (borg.trait[0xd3] + borg.trait[0xf7] < 2) {
              return "restock teleport + teleport level scrolls";
            }
            if (0x40 < range) {
              iVar1 = borg.trait[0xd7];
              iVar5 = borg.has[kv_rod_healing] + borg.trait[0xd6] + iVar1;
              if (iVar5 == 0 ||
                  SCARRY4(borg.has[kv_rod_healing] + borg.trait[0xd6],iVar1) != iVar5 < 0) {
                return "restock heal";
              }
              if (99 < range) {
                pcVar4 = "restock *heal*";
                if (9 < borg_t - borg_began) {
                  pcVar4 = (char *)0x0;
                }
                if (0xe < iVar1) {
                  pcVar4 = (char *)0x0;
                }
                return pcVar4;
              }
            }
          }
        }
      }
    }
  }
  return (char *)0x0;
}

Assistant:

extern const char *borg_must_return_to_town(void)
{
    /* don't need to go to town if in town */
    if (borg.trait[BI_CDEPTH] == 0)
        return ((char *)NULL);

    /* Always spend time on a level unless 100*/
    if (borg_t - borg_began < 100 && borg.trait[BI_CDEPTH] != 100)
        return ((char *)NULL);

    /* need to return to town if restock is needed */
    return borg_restock(borg.trait[BI_CDEPTH]);
}